

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GravityCompensationHelpers.cpp
# Opt level: O0

bool __thiscall
iDynTree::GravityCompensationHelper::updateKinematicsFromGravity
          (GravityCompensationHelper *this,JointPosDoubleArray *jointPos,FrameIndex *floatingFrame,
          Vector3 *gravity)

{
  double *pdVar1;
  VectorFixSize<3U> *in_RCX;
  byte *in_RDI;
  double dVar2;
  Vector3 properClassicalAcceleration;
  Vector3 *in_stack_000002a8;
  FrameIndex *in_stack_000002b0;
  JointPosDoubleArray *in_stack_000002b8;
  GravityCompensationHelper *in_stack_000002c0;
  VectorFixSize<3U> local_40;
  VectorFixSize<3U> *local_28;
  bool local_1;
  
  if ((*in_RDI & 1) == 0) {
    iDynTree::reportError
              ("GravityCompensationHelper","updateKinematicsFromGravity",
               "Model and sensors information is not set");
    local_1 = false;
  }
  else {
    local_28 = in_RCX;
    VectorFixSize<3U>::VectorFixSize(&local_40);
    dVar2 = VectorFixSize<3U>::operator()(local_28,0);
    pdVar1 = VectorFixSize<3U>::operator()(&local_40,0);
    *pdVar1 = -dVar2;
    dVar2 = VectorFixSize<3U>::operator()(local_28,1);
    pdVar1 = VectorFixSize<3U>::operator()(&local_40,1);
    *pdVar1 = -dVar2;
    dVar2 = VectorFixSize<3U>::operator()(local_28,2);
    pdVar1 = VectorFixSize<3U>::operator()(&local_40,2);
    *pdVar1 = -dVar2;
    local_1 = updateKinematicsFromProperAcceleration
                        (in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,in_stack_000002a8);
  }
  return local_1;
}

Assistant:

bool GravityCompensationHelper::updateKinematicsFromGravity(const JointPosDoubleArray& jointPos, const FrameIndex& floatingFrame, const Vector3& gravity)
  {
    if (!m_isModelValid)
    {
      iDynTree::reportError("GravityCompensationHelper", "updateKinematicsFromGravity", "Model and sensors information is not set");
      return false;
    }
    
    iDynTree::Vector3 properClassicalAcceleration;
    properClassicalAcceleration(0) = -gravity(0);
    properClassicalAcceleration(1) = -gravity(1);
    properClassicalAcceleration(2) = -gravity(2);
    
    return updateKinematicsFromProperAcceleration(jointPos, floatingFrame, properClassicalAcceleration);
  }